

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

optional<pbrt::SquareMatrix<4>_> * pbrt::Inverse<4>(SquareMatrix<4> *m)

{
  Float FVar1;
  float fVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  undefined8 uVar6;
  long in_RCX;
  long lVar7;
  long in_RDX;
  optional<pbrt::SquareMatrix<4>_> *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar42 [16];
  undefined1 auVar41 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined4 uVar46;
  undefined1 local_88 [64];
  optional<pbrt::SquareMatrix<4>_> *local_40 [8];
  
  FVar1 = m->m[0][0];
  fVar2 = m->m[1][0];
  FVar3 = m->m[2][0];
  FVar4 = m->m[3][0];
  auVar8 = vgatherdps_avx512vl(*(undefined4 *)((long)m->m[0] + in_RCX));
  auVar40 = ZEXT1664(auVar8);
  auVar9 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)FVar4),0x10);
  auVar10._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar10._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar10._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar10._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar25 = vinsertps_avx(ZEXT416((uint)FVar1),ZEXT416((uint)FVar3),0x10);
  auVar14 = vshufpd_avx(auVar8,auVar8,1);
  auVar25 = vfmsub213ps_fma(auVar25,auVar14,auVar10);
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar45._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
  auVar45._8_4_ = -auVar9._8_4_;
  auVar45._12_4_ = -auVar9._12_4_;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar8,auVar10);
  auVar43._0_4_ = auVar25._0_4_ + auVar9._0_4_;
  auVar43._4_4_ = auVar25._4_4_ + auVar9._4_4_;
  auVar43._8_4_ = auVar25._8_4_ + auVar9._8_4_;
  auVar43._12_4_ = auVar25._12_4_ + auVar9._12_4_;
  auVar25 = vmovshdup_avx(auVar43);
  auVar29 = vgatherdps_avx512vl(*(undefined4 *)((long)m->m[0] + in_RDX));
  auVar28 = auVar29._0_16_;
  auVar41 = ZEXT3264(auVar29);
  auVar30 = vpermpd_avx2(auVar29,0xe6);
  auVar9 = vinsertps_avx(auVar14,ZEXT416((uint)FVar4),0x10);
  auVar9 = vpermt2ps_avx512vl(auVar9,_DAT_00473db0,ZEXT416((uint)fVar2));
  auVar44 = vpermps_avx2(ZEXT1632(_DAT_00473dc0),auVar29);
  auVar10 = vmulps_avx512vl(auVar9,auVar44._0_16_);
  auVar9 = vinsertps_avx(auVar8,ZEXT416((uint)FVar3),0x10);
  auVar9 = vpermt2ps_avx512vl(auVar9,_DAT_00473db0,ZEXT416((uint)FVar1));
  auVar42 = auVar29._16_16_;
  auVar11 = vpermi2ps_avx512vl(_DAT_00473dd0,auVar42,auVar28);
  auVar9 = vfmsub213ps_avx512vl(auVar11,auVar9,auVar10);
  auVar11 = vshufps_avx512vl(auVar42,auVar8,0xb2);
  auVar12 = vxorps_avx512vl(auVar11,auVar18);
  auVar13 = vpermi2ps_avx512vl(_DAT_00473de0,auVar45,auVar12);
  auVar10 = vfmadd213ps_avx512vl(auVar13,auVar44._0_16_,auVar10);
  auVar13 = vaddps_avx512vl(auVar9,auVar10);
  auVar10 = vshufps_avx(auVar30._0_16_,auVar30._0_16_,0xed);
  auVar15._0_4_ = fVar2 * auVar10._0_4_;
  auVar15._4_4_ = auVar14._4_4_ * auVar10._4_4_;
  auVar15._8_4_ = auVar14._8_4_ * auVar10._8_4_;
  auVar15._12_4_ = auVar14._12_4_ * auVar10._12_4_;
  auVar14._4_12_ = auVar8._4_12_;
  auVar14._0_4_ = FVar1;
  auVar9 = vinsertps_avx512f(auVar28,auVar42,0x9c);
  auVar14 = vfmsub213ps_avx512vl(auVar9,auVar14,auVar15);
  auVar9 = vinsertps_avx(auVar45,auVar12,0x9c);
  auVar9 = vfmadd213ps_fma(auVar9,auVar10,auVar15);
  auVar10 = vaddps_avx512vl(auVar14,auVar9);
  auVar9 = vmovshdup_avx(auVar10);
  auVar14 = vshufps_avx(auVar42,auVar42,0x77);
  auVar15 = vmulps_avx512vl(auVar11,auVar14);
  auVar16 = vshufps_avx512vl(auVar28,auVar8,0x17);
  auVar17 = vshufps_avx512vl(auVar28,auVar28,0x22);
  auVar16 = vfmsub213ps_avx512vl(auVar17,auVar16,auVar15);
  auVar14 = vfnmadd213ps_avx512vl(auVar14,auVar11,auVar15);
  auVar14 = vaddps_avx512vl(auVar16,auVar14);
  auVar11 = vshufps_avx512vl(auVar13,auVar13,0xff);
  auVar15 = vxorps_avx512vl(auVar11,auVar18);
  auVar16 = vshufps_avx512vl(auVar14,auVar14,0xff);
  auVar17 = vxorps_avx512vl(auVar16,auVar18);
  auVar18 = vmulss_avx512f(auVar43,auVar14);
  auVar19 = vfmsub213ss_avx512f(auVar14,auVar43,auVar18);
  auVar20 = vshufpd_avx512vl(auVar14,auVar14,1);
  auVar15 = vmulss_avx512f(auVar20,auVar15);
  auVar11 = vfnmsub213ss_avx512f(auVar20,auVar11,auVar15);
  auVar20 = vmulss_avx512f(auVar10,auVar9);
  auVar9 = vfmsub213ss_avx512f(auVar9,auVar10,auVar20);
  auVar21 = vshufpd_avx512vl(auVar13,auVar13,1);
  auVar22 = vmulss_avx512f(auVar13,auVar21);
  auVar21 = vfmsub213ss_avx512f(auVar21,auVar13,auVar22);
  auVar23 = vmovshdup_avx512vl(auVar14);
  auVar24 = vmulss_avx512f(auVar23,auVar25);
  auVar25 = vfmsub213ss_avx512f(auVar25,auVar23,auVar24);
  auVar23 = vmovshdup_avx512vl(auVar13);
  auVar17 = vmulss_avx512f(auVar23,auVar17);
  auVar16 = vfnmsub213ss_avx512f(auVar23,auVar16,auVar17);
  auVar23 = vaddss_avx512f(auVar24,auVar17);
  auVar26 = vsubss_avx512f(auVar23,auVar17);
  auVar27 = vsubss_avx512f(auVar23,auVar26);
  auVar24 = vsubss_avx512f(auVar24,auVar26);
  auVar17 = vsubss_avx512f(auVar17,auVar27);
  auVar17 = vaddss_avx512f(auVar24,auVar17);
  auVar16 = vaddss_avx512f(auVar16,auVar17);
  auVar17 = vaddss_avx512f(auVar23,auVar22);
  auVar24 = vsubss_avx512f(auVar17,auVar23);
  auVar26 = vsubss_avx512f(auVar17,auVar24);
  auVar22 = vsubss_avx512f(auVar22,auVar24);
  auVar23 = vsubss_avx512f(auVar23,auVar26);
  auVar22 = vaddss_avx512f(auVar22,auVar23);
  auVar25 = vaddss_avx512f(auVar22,ZEXT416((uint)(auVar25._0_4_ + auVar16._0_4_)));
  auVar25 = vaddss_avx512f(auVar21,auVar25);
  auVar16 = vaddss_avx512f(auVar20,auVar17);
  auVar21 = vsubss_avx512f(auVar16,auVar17);
  auVar22 = vsubss_avx512f(auVar16,auVar21);
  auVar20 = vsubss_avx512f(auVar20,auVar21);
  auVar17 = vsubss_avx512f(auVar17,auVar22);
  auVar17 = vaddss_avx512f(auVar20,auVar17);
  auVar20 = vaddss_avx512f(auVar15,auVar16);
  auVar21 = vsubss_avx512f(auVar20,auVar16);
  auVar22 = vsubss_avx512f(auVar20,auVar21);
  auVar15 = vsubss_avx512f(auVar15,auVar21);
  auVar16 = vsubss_avx512f(auVar16,auVar22);
  auVar15 = vaddss_avx512f(auVar15,auVar16);
  auVar9 = vaddss_avx512f(auVar11,ZEXT416((uint)(auVar15._0_4_ +
                                                auVar9._0_4_ + auVar17._0_4_ + auVar25._0_4_)));
  auVar25 = vaddss_avx512f(auVar18,auVar20);
  auVar11 = vsubss_avx512f(auVar25,auVar20);
  auVar15 = vsubss_avx512f(auVar25,auVar11);
  auVar11 = vsubss_avx512f(auVar18,auVar11);
  auVar15 = vsubss_avx512f(auVar20,auVar15);
  auVar11 = vaddss_avx512f(auVar11,auVar15);
  auVar9 = vaddss_avx512f(auVar19,ZEXT416((uint)(auVar11._0_4_ + auVar9._0_4_)));
  fVar5 = auVar25._0_4_ + auVar9._0_4_;
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    in_RDI->optionalValue =
         (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
         (ZEXT464(0) << 0x20);
    *(undefined4 *)&in_RDI->set = 0;
    return in_RDI;
  }
  auVar9 = vmovshdup_avx(auVar42);
  auVar31 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar16._0_4_ = auVar9._0_4_ ^ auVar31._0_4_;
  auVar16._4_4_ = auVar9._4_4_ ^ auVar31._4_4_;
  auVar16._8_4_ = auVar9._8_4_ ^ auVar31._8_4_;
  auVar16._12_4_ = auVar9._12_4_ ^ auVar31._12_4_;
  auVar9 = vshufps_avx(auVar28,auVar28,0xff);
  auVar32 = vbroadcastss_avx512f(ZEXT416((uint)FVar1));
  auVar28 = vxorps_avx512vl(auVar32._0_16_,auVar31._0_16_);
  auVar33 = vbroadcastss_avx512f(ZEXT416((uint)FVar3));
  auVar11 = vxorps_avx512vl(auVar33._0_16_,auVar31._0_16_);
  auVar34 = vpermi2ps_avx512f(_DAT_00473f00,ZEXT1664(auVar14),ZEXT1664(auVar10));
  auVar35 = vpermi2ps_avx512f(_DAT_00473f40,auVar34,ZEXT1664(auVar13));
  auVar25 = vshufps_avx(auVar8,auVar8,0xd4);
  auVar36 = vxorps_avx512dq(ZEXT1664(auVar25),auVar31);
  auVar25 = vshufps_avx(auVar8,auVar36._0_16_,0x8e);
  auVar30 = vpermi2ps_avx512vl(_DAT_00473e80,ZEXT1632(auVar25),ZEXT1632(auVar45));
  auVar37 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
  auVar38 = vbroadcastss_avx512f(auVar28);
  auVar39 = vbroadcastss_avx512f(ZEXT416((uint)FVar4));
  auVar32 = vpermi2ps_avx512f(_DAT_00473f80,
                              ZEXT4464(CONCAT440(auVar39._40_4_,
                                                 CONCAT436(auVar38._36_4_,
                                                           CONCAT432(auVar37._32_4_,
                                                                     CONCAT428(auVar33._28_4_,
                                                                               CONCAT424(auVar30.
                                                  _24_4_,CONCAT420(auVar32._20_4_,auVar30._0_20_))))
                                                  ))),ZEXT1664(auVar11));
  auVar33 = vmulps_avx512f(auVar35,auVar32);
  auVar32 = vfmsub213ps_avx512f(auVar32,auVar35,auVar33);
  auVar34 = vpermps_avx512f(ZEXT1664(_DAT_00473df0),auVar34);
  auVar30 = vpermi2ps_avx512vl(_DAT_00473ea0,ZEXT1632(auVar13),auVar34._0_32_);
  uVar46 = auVar10._0_4_;
  auVar44._4_4_ = uVar46;
  auVar44._0_4_ = uVar46;
  auVar44._8_4_ = uVar46;
  auVar44._12_4_ = uVar46;
  auVar44._16_4_ = uVar46;
  auVar44._20_4_ = uVar46;
  auVar44._24_4_ = uVar46;
  auVar44._28_4_ = uVar46;
  auVar30 = vblendps_avx(auVar30,auVar44,0x80);
  auVar34 = vpermi2ps_avx512f(_DAT_00473fc0,ZEXT3264(auVar30),ZEXT1664(auVar43));
  auVar35 = vpermps_avx512f(_DAT_00474000,auVar34);
  auVar10 = vpermi2ps_avx512vl(ZEXT816(0x400000001),auVar12,auVar16);
  auVar30 = vpermps_avx2(ZEXT1632(_DAT_00473e10),auVar29);
  auVar14 = vshufps_avx(auVar30._0_16_,auVar30._0_16_,0x93);
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(auVar14,auVar8);
  auVar30 = vpermpd_avx2(ZEXT1632(auVar14),0x10);
  auVar30 = vblendps_avx(auVar30,ZEXT1632(auVar10),7);
  auVar31 = vpermi2ps_avx512f(_DAT_00474040,
                              ZEXT3264(CONCAT428(auVar9._0_4_ ^ auVar31._0_4_,auVar30._0_28_)),
                              ZEXT1664(auVar12));
  auVar31 = vpermi2ps_avx512f(_DAT_00474080,auVar31,auVar36);
  auVar31 = vpermi2ps_avx512f(_DAT_004740c0,auVar31,auVar40);
  auVar37 = vpermi2ps_avx512f(_DAT_00474100,auVar31,auVar41);
  auVar35 = vmulps_avx512f(auVar35,auVar37);
  auVar37 = vpermps_avx512f(_DAT_00474140,auVar34);
  auVar38 = vpermi2ps_avx512f(_DAT_00474180,auVar41,auVar40);
  auVar38 = vpermi2pd_avx512f(_DAT_004741c0,auVar38,ZEXT1664(auVar12));
  auVar38 = vpermi2ps_avx512f(_DAT_00474200,auVar38,auVar36);
  auVar37 = vmulps_avx512f(auVar37,auVar38);
  auVar38 = vpermilps_avx512f(auVar37,_DAT_00474240);
  auVar39 = vblendmpd_avx512f(auVar38,auVar35);
  auVar39._0_56_ = auVar36._0_56_;
  auVar36 = vblendmpd_avx512f(auVar35,auVar37);
  auVar36._0_56_ = auVar37._0_56_;
  auVar40 = vpermi2ps_avx512f(_DAT_00474280,auVar41,auVar40);
  auVar41 = vpermps_avx512f(_DAT_004742c0,auVar34);
  auVar40 = vfmsub213ps_avx512f(auVar41,auVar40,auVar39);
  auVar41 = vpermi2ps_avx512f(_DAT_00474300,auVar31,ZEXT1664(auVar25));
  auVar31 = vpermps_avx512f(_DAT_00474340,auVar34);
  auVar41 = vfmsub213ps_avx512f(auVar31,auVar41,auVar36);
  auVar31 = vaddps_avx512f(auVar38,auVar35);
  auVar34 = vsubps_avx512f(auVar31,auVar36);
  auVar35 = vsubps_avx512f(auVar31,auVar34);
  auVar34 = vsubps_avx512f(auVar39,auVar34);
  auVar35 = vsubps_avx512f(auVar36,auVar35);
  auVar34 = vaddps_avx512f(auVar34,auVar35);
  auVar41 = vaddps_avx512f(auVar41,auVar34);
  auVar40 = vaddps_avx512f(auVar40,auVar41);
  auVar41 = vaddps_avx512f(auVar33,auVar31);
  auVar34 = vsubps_avx512f(auVar41,auVar31);
  auVar35 = vsubps_avx512f(auVar41,auVar34);
  auVar33 = vsubps_avx512f(auVar33,auVar34);
  auVar31 = vsubps_avx512f(auVar31,auVar35);
  auVar31 = vaddps_avx512f(auVar33,auVar31);
  auVar40 = vaddps_avx512f(auVar31,auVar40);
  auVar40 = vaddps_avx512f(auVar32,auVar40);
  auVar40 = vaddps_avx512f(auVar41,auVar40);
  auVar41 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar5)));
  local_88 = vmulps_avx512f(auVar40,auVar41);
  lVar7 = 0;
  local_40[7] = in_RDI;
  do {
    uVar6 = *(undefined8 *)(local_88 + lVar7 + 8);
    *(undefined8 *)((long)local_40 + lVar7) = *(undefined8 *)(local_88 + lVar7);
    *(undefined8 *)((long)local_40 + lVar7 + 8) = uVar6;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  in_RDI->set = true;
  *(optional<pbrt::SquareMatrix<4>_> **)&in_RDI->optionalValue = local_40[0];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 8) = local_40[1];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x10) = local_40[2];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x18) = local_40[3];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x20) = local_40[4];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x28) = local_40[5];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x30) = local_40[6];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x38) = local_40[7];
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<SquareMatrix<4>> Inverse(const SquareMatrix<4> &m) {
    // Via: https://github.com/google/ion/blob/master/ion/math/matrixutils.cc,
    // (c) Google, Apache license.

    // For 4x4 do not compute the adjugate as the transpose of the cofactor
    // matrix, because this results in extra work. Several calculations can be
    // shared across the sub-determinants.
    //
    // This approach is explained in David Eberly's Geometric Tools book,
    // excerpted here:
    //   http://www.geometrictools.com/Documentation/LaplaceExpansionTheorem.pdf
    Float s0 = DifferenceOfProducts(m[0][0], m[1][1], m[1][0], m[0][1]);
    Float s1 = DifferenceOfProducts(m[0][0], m[1][2], m[1][0], m[0][2]);
    Float s2 = DifferenceOfProducts(m[0][0], m[1][3], m[1][0], m[0][3]);

    Float s3 = DifferenceOfProducts(m[0][1], m[1][2], m[1][1], m[0][2]);
    Float s4 = DifferenceOfProducts(m[0][1], m[1][3], m[1][1], m[0][3]);
    Float s5 = DifferenceOfProducts(m[0][2], m[1][3], m[1][2], m[0][3]);

    Float c0 = DifferenceOfProducts(m[2][0], m[3][1], m[3][0], m[2][1]);
    Float c1 = DifferenceOfProducts(m[2][0], m[3][2], m[3][0], m[2][2]);
    Float c2 = DifferenceOfProducts(m[2][0], m[3][3], m[3][0], m[2][3]);

    Float c3 = DifferenceOfProducts(m[2][1], m[3][2], m[3][1], m[2][2]);
    Float c4 = DifferenceOfProducts(m[2][1], m[3][3], m[3][1], m[2][3]);
    Float c5 = DifferenceOfProducts(m[2][2], m[3][3], m[3][2], m[2][3]);

    Float determinant = InnerProduct(s0, c5, -s1, c4, s2, c3, s3, c2, s5, c0, -s4, c1);
    if (determinant == 0)
        return {};
    Float s = 1 / determinant;

    Float inv[4][4] = {s * InnerProduct(m[1][1], c5, m[1][3], c3, -m[1][2], c4),
                       s * InnerProduct(-m[0][1], c5, m[0][2], c4, -m[0][3], c3),
                       s * InnerProduct(m[3][1], s5, m[3][3], s3, -m[3][2], s4),
                       s * InnerProduct(-m[2][1], s5, m[2][2], s4, -m[2][3], s3),

                       s * InnerProduct(-m[1][0], c5, m[1][2], c2, -m[1][3], c1),
                       s * InnerProduct(m[0][0], c5, m[0][3], c1, -m[0][2], c2),
                       s * InnerProduct(-m[3][0], s5, m[3][2], s2, -m[3][3], s1),
                       s * InnerProduct(m[2][0], s5, m[2][3], s1, -m[2][2], s2),

                       s * InnerProduct(m[1][0], c4, m[1][3], c0, -m[1][1], c2),
                       s * InnerProduct(-m[0][0], c4, m[0][1], c2, -m[0][3], c0),
                       s * InnerProduct(m[3][0], s4, m[3][3], s0, -m[3][1], s2),
                       s * InnerProduct(-m[2][0], s4, m[2][1], s2, -m[2][3], s0),

                       s * InnerProduct(-m[1][0], c3, m[1][1], c1, -m[1][2], c0),
                       s * InnerProduct(m[0][0], c3, m[0][2], c0, -m[0][1], c1),
                       s * InnerProduct(-m[3][0], s3, m[3][1], s1, -m[3][2], s0),
                       s * InnerProduct(m[2][0], s3, m[2][2], s0, -m[2][1], s1)};

    return SquareMatrix<4>(inv);
}